

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O1

void testProcrustesImp<float>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  size_t numPoints;
  float __x;
  float fVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  double dVar40;
  double dVar41;
  double dVar42;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> toPoints;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> fromPoints;
  Rand48 random;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> local_2b8;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> local_298;
  double local_278;
  double dStack_270;
  double local_268;
  double dStack_260;
  double local_258;
  double dStack_250;
  undefined1 local_248 [16];
  double local_238;
  double dStack_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  ushort local_1fe [3];
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double dStack_1e0;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  undefined4 uStack_1cc;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  undefined1 local_158 [8];
  undefined1 auStack_150 [16];
  undefined1 auStack_140 [16];
  double dStack_130;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  double local_108;
  undefined1 auStack_100 [16];
  undefined1 auStack_f0 [16];
  double dStack_e0;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  Euler<double> local_58;
  
  Imath_3_2::procrustesRotationAndTranslation<float>
            ((Vec3 *)&local_d8,(Vec3 *)0x0,(float *)0x0,0,false);
  auVar16._8_8_ = -(ulong)(dStack_60 != 1.0);
  auVar16._0_8_ = -(ulong)(local_68 != 0.0);
  auVar15._8_8_ = -(ulong)(dStack_70 != 0.0);
  auVar15._0_8_ = -(ulong)(local_78 != 0.0);
  auVar16 = packssdw(auVar15,auVar16);
  auVar27._8_8_ = -(ulong)(dStack_80 != 0.0);
  auVar27._0_8_ = -(ulong)(local_88 != 1.0);
  auVar26._8_8_ = -(ulong)(dStack_90 != 0.0);
  auVar26._0_8_ = -(ulong)(local_98 != 0.0);
  auVar27 = packssdw(auVar26,auVar27);
  auVar27 = packssdw(auVar27,auVar16);
  auVar31._8_8_ = -(ulong)(dStack_a0 != 0.0);
  auVar31._0_8_ = -(ulong)(local_a8 != 0.0);
  auVar17._8_8_ = -(ulong)(dStack_b0 != 1.0);
  auVar17._0_8_ = -(ulong)(local_b8 != 0.0);
  auVar16 = packssdw(auVar17,auVar31);
  auVar8._8_8_ = -(ulong)(dStack_c0 != 0.0);
  auVar8._0_8_ = -(ulong)(local_c8 != 0.0);
  auVar30._8_8_ = -(ulong)(dStack_d0 != 0.0);
  auVar30._0_8_ = -(ulong)(local_d8 != 1.0);
  auVar31 = packssdw(auVar30,auVar8);
  auVar16 = packssdw(auVar31,auVar16);
  auVar16 = packsswb(auVar16,auVar27);
  if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar16 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar16 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar16 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar16 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar16 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar16 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar16[0xf] < '\0') {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,299,"void testProcrustesImp() [T = float]");
  }
  Imath_3_2::procrustesRotationAndTranslation<float>((Vec3 *)local_158,(Vec3 *)0x0,0,false);
  local_d8 = (double)local_158;
  dStack_d0 = (double)auStack_150._0_8_;
  local_c8 = (double)auStack_150._8_8_;
  dStack_c0 = (double)auStack_140._0_8_;
  local_b8 = (double)auStack_140._8_8_;
  dStack_b0 = dStack_130;
  local_a8 = (double)local_128._0_8_;
  dStack_a0 = (double)local_128._8_8_;
  local_98 = (double)local_118._0_8_;
  dStack_90 = (double)local_118._8_8_;
  local_88 = local_108;
  dStack_80 = (double)auStack_100._0_8_;
  local_78 = (double)auStack_100._8_8_;
  dStack_70 = (double)auStack_f0._0_8_;
  local_68 = (double)auStack_f0._8_8_;
  dStack_60 = dStack_e0;
  auVar39._8_8_ = -(ulong)((double)auStack_f0._0_8_ != 0.0);
  auVar39._0_8_ = -(ulong)((double)auStack_100._8_8_ != 0.0);
  auVar3._8_8_ = -(ulong)(dStack_e0 != 1.0);
  auVar3._0_8_ = -(ulong)((double)auStack_f0._8_8_ != 0.0);
  auVar27 = packssdw(auVar39,auVar3);
  auVar32._8_8_ = -(ulong)((double)local_118._8_8_ != 0.0);
  auVar32._0_8_ = -(ulong)((double)local_118._0_8_ != 0.0);
  auVar2._8_8_ = -(ulong)((double)auStack_100._0_8_ != 0.0);
  auVar2._0_8_ = -(ulong)(local_108 != 1.0);
  auVar16 = packssdw(auVar32,auVar2);
  auVar31 = packssdw(auVar16,auVar27);
  auVar18._8_8_ = -(ulong)(dStack_130 != 1.0);
  auVar18._0_8_ = -(ulong)((double)auStack_140._8_8_ != 0.0);
  auVar1._8_8_ = -(ulong)((double)local_128._8_8_ != 0.0);
  auVar1._0_8_ = -(ulong)((double)local_128._0_8_ != 0.0);
  auVar27 = packssdw(auVar18,auVar1);
  auVar28._8_8_ = -(ulong)((double)auStack_140._0_8_ != 0.0);
  auVar28._0_8_ = -(ulong)((double)auStack_150._8_8_ != 0.0);
  auVar9._8_8_ = -(ulong)((double)auStack_150._0_8_ != 0.0);
  auVar9._0_8_ = -(ulong)((double)local_158 != 1.0);
  auVar16 = packssdw(auVar9,auVar28);
  auVar16 = packssdw(auVar16,auVar27);
  auVar16 = packsswb(auVar16,auVar31);
  if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar16 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar16 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar16 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar16 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar16 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar16 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar16 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar16 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar16 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar16 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar16 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar16[0xf] < '\0') {
    __assert_fail("id == IMATH_INTERNAL_NAMESPACE::M44d ()",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                  ,0x131,"void testProcrustesImp() [T = float]");
  }
  local_158 = (undefined1  [8])0x3ff0000000000000;
  auStack_150 = (undefined1  [16])0x0;
  auStack_140 = (undefined1  [16])0x0;
  dStack_130 = 1.0;
  local_128 = (undefined1  [16])0x0;
  local_118 = (undefined1  [16])0x0;
  local_108 = 1.0;
  auStack_100 = (undefined1  [16])0x0;
  auStack_f0 = (undefined1  [16])0x0;
  dStack_e0 = 1.0;
  testTranslationRotationMatrix<float>((M44d *)local_158);
  auStack_f0._8_8_ =
       local_108 * -0.2 + (double)auStack_150._8_8_ * 3.0 + (double)local_128._0_8_ * 5.0 +
       (double)auStack_f0._8_8_;
  dStack_e0 = (double)auStack_100._0_8_ * -0.2 +
              (double)auStack_140._0_8_ * 3.0 + (double)local_128._8_8_ * 5.0 + dStack_e0;
  auStack_100._8_8_ =
       (double)local_118._0_8_ * -0.2 + (double)local_158 * 3.0 + (double)auStack_140._8_8_ * 5.0 +
       (double)auStack_100._8_8_;
  auStack_f0._0_8_ =
       (double)local_118._8_8_ * -0.2 + (double)auStack_150._0_8_ * 3.0 + dStack_130 * 5.0 +
       (double)auStack_f0._0_8_;
  testTranslationRotationMatrix<float>((M44d *)local_158);
  dVar35 = (double)local_158 * 0.0;
  dVar37 = (double)auStack_150._0_8_ * 0.0;
  dVar25 = (double)auStack_140._8_8_ * -1.2246467991473532e-16;
  dVar29 = dStack_130 * -1.2246467991473532e-16;
  local_158 = (undefined1  [8])
              ((double)local_118._0_8_ * -0.0 + (double)auStack_140._8_8_ * 0.0 + (double)local_158)
  ;
  auStack_150._0_8_ = (double)local_118._8_8_ * -0.0 + dStack_130 * 0.0 + (double)auStack_150._0_8_;
  auStack_140._8_8_ =
       (double)local_118._0_8_ * 1.2246467991473532e-16 + (dVar35 - (double)auStack_140._8_8_);
  dStack_130 = (double)local_118._8_8_ * 1.2246467991473532e-16 + (dVar37 - dStack_130);
  dVar11 = (double)auStack_150._8_8_ * 0.0;
  dVar19 = (double)auStack_140._0_8_ * 0.0;
  dVar7 = (double)local_128._0_8_ * -1.2246467991473532e-16;
  dVar10 = (double)local_128._8_8_ * -1.2246467991473532e-16;
  auStack_150._8_8_ = local_108 * -0.0 + (double)local_128._0_8_ * 0.0 + (double)auStack_150._8_8_;
  auStack_140._0_8_ =
       (double)auStack_100._0_8_ * -0.0 + (double)local_128._8_8_ * 0.0 + (double)auStack_140._0_8_;
  local_128._0_8_ = local_108 * 1.2246467991473532e-16 + (dVar11 - (double)local_128._0_8_);
  local_128._8_8_ =
       (double)auStack_100._0_8_ * 1.2246467991473532e-16 + (dVar19 - (double)local_128._8_8_);
  local_108 = (dVar7 + dVar11) - local_108;
  local_118._0_8_ = (dVar25 + dVar35) - (double)local_118._0_8_;
  local_118._8_8_ = (dVar29 + dVar37) - (double)local_118._8_8_;
  auStack_100._0_8_ = (dVar10 + dVar19) - (double)auStack_100._0_8_;
  testTranslationRotationMatrix<float>((M44d *)local_158);
  dVar11 = (double)auStack_140._8_8_ * 0.0;
  dVar19 = dStack_130 * 0.0;
  dVar35 = (double)local_118._0_8_ * -0.7071067811865475;
  dVar37 = (double)local_118._8_8_ * -0.7071067811865475;
  auStack_140._8_8_ =
       (double)local_118._0_8_ * 0.0 + (double)local_158 * 0.0 + (double)auStack_140._8_8_;
  dStack_130 = (double)local_118._8_8_ * 0.0 + (double)auStack_150._0_8_ * 0.0 + dStack_130;
  local_118._0_8_ =
       (double)local_118._0_8_ * 0.7071067811865476 +
       (double)local_158 * 0.7071067811865475 + dVar11;
  local_118._8_8_ =
       (double)local_118._8_8_ * 0.7071067811865476 +
       (double)auStack_150._0_8_ * 0.7071067811865475 + dVar19;
  dVar7 = (double)local_128._0_8_ * 0.0;
  dVar10 = (double)local_128._8_8_ * 0.0;
  dVar25 = local_108 * -0.7071067811865475;
  dVar29 = (double)auStack_100._0_8_ * -0.7071067811865475;
  local_128._0_8_ = local_108 * 0.0 + (double)auStack_150._8_8_ * 0.0 + (double)local_128._0_8_;
  local_128._8_8_ =
       (double)auStack_100._0_8_ * 0.0 + (double)auStack_140._0_8_ * 0.0 + (double)local_128._8_8_;
  local_108 = local_108 * 0.7071067811865476 +
              (double)auStack_150._8_8_ * 0.7071067811865475 + dVar7;
  auStack_100._0_8_ =
       (double)auStack_100._0_8_ * 0.7071067811865476 +
       (double)auStack_140._0_8_ * 0.7071067811865475 + dVar10;
  local_158 = (undefined1  [8])(dVar35 + (double)local_158 * 0.7071067811865476 + dVar11);
  auStack_150._0_8_ = dVar37 + (double)auStack_150._0_8_ * 0.7071067811865476 + dVar19;
  auStack_150._8_8_ = dVar25 + (double)auStack_150._8_8_ * 0.7071067811865476 + dVar7;
  auStack_140._0_8_ = dVar29 + (double)auStack_140._0_8_ * 0.7071067811865476 + dVar10;
  testTranslationRotationMatrix<float>((M44d *)local_158);
  dVar36 = (double)auStack_140._8_8_ * -0.7071067811865476;
  dVar38 = dStack_130 * -0.7071067811865476;
  dVar35 = (double)auStack_140._8_8_ * 0.0;
  dVar33 = dStack_130 * 0.0;
  dVar10 = (double)local_158 * -0.0;
  dVar19 = (double)auStack_150._0_8_ * -0.0;
  auStack_140._8_8_ =
       (double)local_118._0_8_ * 0.0 +
       (double)local_158 * 0.7071067811865476 + (double)auStack_140._8_8_ * -0.7071067811865475;
  dStack_130 = (double)local_118._8_8_ * 0.0 +
               (double)auStack_150._0_8_ * 0.7071067811865476 + dStack_130 * -0.7071067811865475;
  dVar37 = (double)local_128._0_8_ * -0.7071067811865476;
  dVar34 = (double)local_128._8_8_ * -0.7071067811865476;
  dVar25 = (double)local_128._0_8_ * 0.0;
  dVar29 = (double)local_128._8_8_ * 0.0;
  dVar7 = (double)auStack_140._0_8_ * -0.0;
  dVar11 = local_108 * -0.0;
  local_128._0_8_ =
       local_108 * 0.0 +
       (double)auStack_150._8_8_ * 0.7071067811865476 +
       (double)local_128._0_8_ * -0.7071067811865475;
  local_128._8_8_ =
       (double)auStack_100._0_8_ * 0.0 +
       (double)auStack_140._0_8_ * 0.7071067811865476 +
       (double)local_128._8_8_ * -0.7071067811865475;
  local_158 = (undefined1  [8])
              ((double)local_118._0_8_ * -0.0 + (double)local_158 * -0.7071067811865475 + dVar36);
  local_108 = (double)auStack_150._8_8_ * -0.0 + dVar25 + local_108;
  auStack_150._0_8_ =
       (double)local_118._8_8_ * -0.0 + (double)auStack_150._0_8_ * -0.7071067811865475 + dVar38;
  auStack_150._8_8_ = dVar11 + (double)auStack_150._8_8_ * -0.7071067811865475 + dVar37;
  auStack_140._0_8_ =
       (double)auStack_100._0_8_ * -0.0 + (double)auStack_140._0_8_ * -0.7071067811865475 + dVar34;
  local_118._0_8_ = dVar10 + dVar35 + (double)local_118._0_8_;
  local_118._8_8_ = dVar19 + dVar33 + (double)local_118._8_8_;
  auStack_100._0_8_ = dVar7 + dVar29 + (double)auStack_100._0_8_;
  testTranslationRotationMatrix<float>((M44d *)local_158);
  local_158 = (undefined1  [8])0x3ff0000000000000;
  auStack_150 = ZEXT816(0);
  auStack_140 = ZEXT816(0);
  dStack_130 = 1.0;
  local_128 = ZEXT816(0);
  local_118 = ZEXT816(0);
  local_108 = 1.0;
  auStack_100 = ZEXT816(0);
  auStack_f0 = ZEXT816(0);
  dStack_e0 = 1.0;
  testWithTranslateRotateAndScale<float>((M44d *)local_158);
  dStack_e0 = (double)auStack_100._0_8_ * 10.0 +
              (double)auStack_140._0_8_ * 0.4 + (double)local_128._8_8_ * 6.0 + dStack_e0;
  auStack_f0._8_8_ =
       local_108 * 10.0 + (double)auStack_150._8_8_ * 0.4 + (double)local_128._0_8_ * 6.0 +
       (double)auStack_f0._8_8_;
  auStack_f0._0_8_ =
       (double)local_118._8_8_ * 10.0 + (double)auStack_150._0_8_ * 0.4 + dStack_130 * 6.0 +
       (double)auStack_f0._0_8_;
  auStack_100._8_8_ =
       (double)local_118._0_8_ * 10.0 + (double)local_158 * 0.4 + (double)auStack_140._8_8_ * 6.0 +
       (double)auStack_100._8_8_;
  testWithTranslateRotateAndScale<float>((M44d *)local_158);
  dVar35 = (double)local_158 * 0.0;
  dVar37 = (double)auStack_150._0_8_ * 0.0;
  dVar25 = (double)auStack_140._8_8_ * -1.2246467991473532e-16;
  dVar29 = dStack_130 * -1.2246467991473532e-16;
  local_158 = (undefined1  [8])
              ((double)local_118._0_8_ * -0.0 + (double)auStack_140._8_8_ * 0.0 + (double)local_158)
  ;
  auStack_150._0_8_ = (double)local_118._8_8_ * -0.0 + dStack_130 * 0.0 + (double)auStack_150._0_8_;
  auStack_140._8_8_ =
       (double)local_118._0_8_ * 1.2246467991473532e-16 + (dVar35 - (double)auStack_140._8_8_);
  dStack_130 = (double)local_118._8_8_ * 1.2246467991473532e-16 + (dVar37 - dStack_130);
  dVar11 = (double)auStack_150._8_8_ * 0.0;
  dVar19 = (double)auStack_140._0_8_ * 0.0;
  dVar7 = (double)local_128._0_8_ * -1.2246467991473532e-16;
  dVar10 = (double)local_128._8_8_ * -1.2246467991473532e-16;
  auStack_150._8_8_ = local_108 * -0.0 + (double)local_128._0_8_ * 0.0 + (double)auStack_150._8_8_;
  auStack_140._0_8_ =
       (double)auStack_100._0_8_ * -0.0 + (double)local_128._8_8_ * 0.0 + (double)auStack_140._0_8_;
  local_128._0_8_ = local_108 * 1.2246467991473532e-16 + (dVar11 - (double)local_128._0_8_);
  local_128._8_8_ =
       (double)auStack_100._0_8_ * 1.2246467991473532e-16 + (dVar19 - (double)local_128._8_8_);
  local_108 = (dVar7 + dVar11) - local_108;
  local_118._0_8_ = (dVar25 + dVar35) - (double)local_118._0_8_;
  local_118._8_8_ = (dVar29 + dVar37) - (double)local_118._8_8_;
  auStack_100._0_8_ = (dVar10 + dVar19) - (double)auStack_100._0_8_;
  testWithTranslateRotateAndScale<float>((M44d *)local_158);
  dVar11 = (double)auStack_140._8_8_ * 0.0;
  dVar19 = dStack_130 * 0.0;
  dVar35 = (double)local_118._0_8_ * -0.7071067811865475;
  dVar37 = (double)local_118._8_8_ * -0.7071067811865475;
  auStack_140._8_8_ =
       (double)local_118._0_8_ * 0.0 + (double)local_158 * 0.0 + (double)auStack_140._8_8_;
  dStack_130 = (double)local_118._8_8_ * 0.0 + (double)auStack_150._0_8_ * 0.0 + dStack_130;
  local_118._0_8_ =
       (double)local_118._0_8_ * 0.7071067811865476 +
       (double)local_158 * 0.7071067811865475 + dVar11;
  local_118._8_8_ =
       (double)local_118._8_8_ * 0.7071067811865476 +
       (double)auStack_150._0_8_ * 0.7071067811865475 + dVar19;
  dVar7 = (double)local_128._0_8_ * 0.0;
  dVar10 = (double)local_128._8_8_ * 0.0;
  dVar25 = local_108 * -0.7071067811865475;
  dVar29 = (double)auStack_100._0_8_ * -0.7071067811865475;
  local_128._0_8_ = local_108 * 0.0 + (double)auStack_150._8_8_ * 0.0 + (double)local_128._0_8_;
  local_128._8_8_ =
       (double)auStack_100._0_8_ * 0.0 + (double)auStack_140._0_8_ * 0.0 + (double)local_128._8_8_;
  local_108 = local_108 * 0.7071067811865476 +
              (double)auStack_150._8_8_ * 0.7071067811865475 + dVar7;
  auStack_100._0_8_ =
       (double)auStack_100._0_8_ * 0.7071067811865476 +
       (double)auStack_140._0_8_ * 0.7071067811865475 + dVar10;
  local_158 = (undefined1  [8])(dVar35 + (double)local_158 * 0.7071067811865476 + dVar11);
  auStack_150._0_8_ = dVar37 + (double)auStack_150._0_8_ * 0.7071067811865476 + dVar19;
  auStack_150._8_8_ = dVar25 + (double)auStack_150._8_8_ * 0.7071067811865476 + dVar7;
  auStack_140._0_8_ = dVar29 + (double)auStack_140._0_8_ * 0.7071067811865476 + dVar10;
  testWithTranslateRotateAndScale<float>((M44d *)local_158);
  dVar36 = (double)auStack_140._8_8_ * -0.7071067811865476;
  dVar38 = dStack_130 * -0.7071067811865476;
  dVar33 = (double)auStack_140._8_8_ * 0.0;
  dVar34 = dStack_130 * 0.0;
  dVar25 = (double)local_158 * -0.0;
  dVar29 = (double)auStack_150._0_8_ * -0.0;
  auStack_140._8_8_ =
       (double)local_118._0_8_ * 0.0 +
       (double)local_158 * 0.7071067811865476 + (double)auStack_140._8_8_ * -0.7071067811865475;
  dStack_130 = (double)local_118._8_8_ * 0.0 +
               (double)auStack_150._0_8_ * 0.7071067811865476 + dStack_130 * -0.7071067811865475;
  dVar7 = (double)auStack_150._8_8_ * 0.7071067811865476;
  dVar10 = (double)auStack_140._0_8_ * 0.7071067811865476;
  dVar35 = (double)local_128._0_8_ * 0.0;
  dVar37 = (double)local_128._8_8_ * 0.0;
  dVar11 = (double)auStack_150._8_8_ * -0.0;
  dVar19 = (double)auStack_140._0_8_ * -0.0;
  auStack_150._8_8_ =
       local_108 * -0.0 +
       (double)auStack_150._8_8_ * -0.7071067811865475 +
       (double)local_128._0_8_ * -0.7071067811865476;
  auStack_140._0_8_ =
       (double)auStack_100._0_8_ * -0.0 +
       (double)auStack_140._0_8_ * -0.7071067811865475 +
       (double)local_128._8_8_ * -0.7071067811865476;
  local_128._0_8_ = local_108 * 0.0 + dVar7 + (double)local_128._0_8_ * -0.7071067811865475;
  local_128._8_8_ =
       (double)auStack_100._0_8_ * 0.0 + dVar10 + (double)local_128._8_8_ * -0.7071067811865475;
  local_158 = (undefined1  [8])
              ((double)local_118._0_8_ * -0.0 + (double)local_158 * -0.7071067811865475 + dVar36);
  local_108 = dVar11 + dVar35 + local_108;
  auStack_150._0_8_ =
       (double)local_118._8_8_ * -0.0 + (double)auStack_150._0_8_ * -0.7071067811865475 + dVar38;
  local_118._0_8_ = dVar25 + dVar33 + (double)local_118._0_8_;
  local_118._8_8_ = dVar29 + dVar34 + (double)local_118._8_8_;
  auStack_100._0_8_ = dVar19 + dVar37 + (double)auStack_100._0_8_;
  testWithTranslateRotateAndScale<float>((M44d *)local_158);
  local_158 = (undefined1  [8])((double)local_158 + (double)local_158);
  auStack_150._0_8_ = (double)auStack_150._0_8_ + (double)auStack_150._0_8_;
  auStack_150._8_8_ = (double)auStack_150._8_8_ + (double)auStack_150._8_8_;
  auStack_140._0_8_ = (double)auStack_140._0_8_ + (double)auStack_140._0_8_;
  auStack_140._8_8_ = (double)auStack_140._8_8_ + (double)auStack_140._8_8_;
  dStack_130 = dStack_130 + dStack_130;
  local_128._0_8_ = (double)local_128._0_8_ + (double)local_128._0_8_;
  local_128._8_8_ = (double)local_128._8_8_ + (double)local_128._8_8_;
  local_118._0_8_ = (double)local_118._0_8_ + (double)local_118._0_8_;
  local_118._8_8_ = (double)local_118._8_8_ + (double)local_118._8_8_;
  local_108 = local_108 + local_108;
  auStack_100._0_8_ = (double)auStack_100._0_8_ + (double)auStack_100._0_8_;
  testWithTranslateRotateAndScale<float>((M44d *)local_158);
  local_158 = (undefined1  [8])((double)local_158 * 0.01);
  auStack_150._8_8_ = (double)auStack_150._8_8_ * 0.01;
  auStack_150._0_8_ = (double)auStack_150._0_8_ * 0.01;
  dStack_130 = dStack_130 * 0.01;
  auStack_140._8_8_ = (double)auStack_140._8_8_ * 0.01;
  auStack_140._0_8_ = (double)auStack_140._0_8_ * 0.01;
  local_128._8_8_ = (double)local_128._8_8_ * 0.01;
  local_128._0_8_ = (double)local_128._0_8_ * 0.01;
  local_118._8_8_ = (double)local_118._8_8_ * 0.01;
  local_118._0_8_ = (double)local_118._0_8_ * 0.01;
  local_108 = local_108 * 0.01;
  auStack_100._0_8_ = (double)auStack_100._0_8_ * 0.01;
  testWithTranslateRotateAndScale<float>((M44d *)local_158);
  local_298.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = 0;
  do {
    __x = (float)lVar5 / 3.1415927;
    fVar6 = cosf(__x);
    local_1d8._4_4_ = sinf(__x);
    fStack_1d0 = 0.0;
    local_1d8._0_4_ = fVar6;
    std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
    emplace_back<Imath_3_2::Vec3<float>>
              ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_298,
               (Vec3<float> *)local_1d8);
    fVar6 = cosf(__x + 1.0471976);
    local_1d8._4_4_ = sinf(__x + 1.0471976);
    fStack_1d0 = 0.0;
    local_1d8._0_4_ = fVar6;
    std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
    emplace_back<Imath_3_2::Vec3<float>>
              ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_2b8,
               (Vec3<float> *)local_1d8);
    lVar5 = lVar5 + 2;
  } while (lVar5 != 8);
  verifyProcrustes<float>(&local_298,&local_2b8);
  local_1fe[0] = 0x7c67;
  local_1fe[1] = 0x1005;
  local_1fe[2] = 0x7c67;
  lVar5 = 1;
  do {
    if (local_298.
        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        local_298.
        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      local_298.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_298.
           super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    lVar4 = lVar5;
    if (local_2b8.
        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish !=
        local_2b8.
        super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>._M_impl
        .super__Vector_impl_data._M_start) {
      local_2b8.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2b8.
           super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
    do {
      dVar7 = (double)Imath_3_2::erand48(local_1fe);
      dVar10 = (double)Imath_3_2::erand48(local_1fe);
      dVar11 = (double)Imath_3_2::erand48(local_1fe);
      local_1d8._0_4_ = (undefined4)dVar7;
      local_1d8._4_4_ = (undefined4)dVar10;
      fStack_1d0 = (float)dVar11;
      std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
      emplace_back<Imath_3_2::Vec3<float>>
                ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_298
                 ,(Vec3<float> *)local_1d8);
      dVar7 = (double)Imath_3_2::erand48(local_1fe);
      dVar10 = (double)Imath_3_2::erand48(local_1fe);
      dVar11 = (double)Imath_3_2::erand48(local_1fe);
      local_1d8._0_4_ = (undefined4)dVar7;
      local_1d8._4_4_ = (undefined4)dVar10;
      fStack_1d0 = (float)dVar11;
      std::vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>>::
      emplace_back<Imath_3_2::Vec3<float>>
                ((vector<Imath_3_2::Vec3<float>,std::allocator<Imath_3_2::Vec3<float>>> *)&local_2b8
                 ,(Vec3<float> *)local_1d8);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 10);
  verifyProcrustes<float>(&local_298,&local_2b8);
  testProcrustesWithMatrix<float>((M44d *)local_158);
  auStack_f0._8_8_ =
       (double)auStack_150._8_8_ * 3.0 + (double)local_128._0_8_ * 4.0 + local_108 +
       (double)auStack_f0._8_8_;
  dStack_e0 = (double)auStack_140._0_8_ * 3.0 + (double)local_128._8_8_ * 4.0 +
              (double)auStack_100._0_8_ + dStack_e0;
  auStack_100._8_8_ =
       (double)local_158 * 3.0 + (double)auStack_140._8_8_ * 4.0 + (double)local_118._0_8_ +
       (double)auStack_100._8_8_;
  auStack_f0._0_8_ =
       (double)auStack_150._0_8_ * 3.0 + dStack_130 * 4.0 + (double)local_118._8_8_ +
       (double)auStack_f0._0_8_;
  testProcrustesWithMatrix<float>((M44d *)local_158);
  auStack_100._8_8_ =
       (double)local_158 * -10.0 + (double)auStack_140._8_8_ + (double)auStack_140._8_8_ +
       (double)local_118._0_8_ + (double)auStack_100._8_8_;
  auStack_f0._0_8_ =
       (double)auStack_150._0_8_ * -10.0 + dStack_130 + dStack_130 + (double)local_118._8_8_ +
       (double)auStack_f0._0_8_;
  auStack_f0._8_8_ =
       (double)auStack_150._8_8_ * -10.0 + (double)local_128._0_8_ + (double)local_128._0_8_ +
       local_108 + (double)auStack_f0._8_8_;
  dStack_e0 = (double)auStack_140._0_8_ * -10.0 + (double)local_128._8_8_ + (double)local_128._8_8_
              + (double)auStack_100._0_8_ + dStack_e0;
  testProcrustesWithMatrix<float>((M44d *)local_158);
  local_58._24_1_ = local_58._24_1_ & 0xe0 | 5;
  local_58.super_Vec3<double>.x = 1.0471975511965976;
  local_58.super_Vec3<double>.y = 2.356194490192345;
  local_58.super_Vec3<double>.z = 0.0;
  Imath_3_2::Euler<double>::toMatrix44((Matrix44<double> *)local_1d8,&local_58);
  local_228 = (double)local_118._8_8_;
  dStack_220 = local_108;
  dVar10 = (double)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
  dVar11 = (double)CONCAT44(uStack_1cc,fStack_1d0);
  local_278 = local_1b8;
  dStack_270 = dStack_1b0;
  local_238 = local_178;
  dStack_230 = dStack_170;
  dVar7 = (double)local_158 * dVar11;
  dVar40 = (double)auStack_150._8_8_ * local_198;
  dVar41 = (double)auStack_150._8_8_ * dStack_190;
  dVar38 = (double)auStack_140._0_8_ * local_178;
  dVar20 = (double)auStack_140._0_8_ * dStack_170;
  local_218 = (double)auStack_f0._0_8_;
  dStack_210 = (double)auStack_f0._8_8_;
  local_258 = local_188;
  dStack_250 = dStack_180;
  dVar19 = (double)auStack_150._8_8_ * dStack_180;
  local_268 = local_168;
  dStack_260 = dStack_160;
  auStack_150._8_8_ =
       (double)auStack_140._0_8_ * local_168 +
       (double)auStack_150._8_8_ * local_188 +
       (double)local_158 * local_1c8 + (double)auStack_150._0_8_ * local_1a8;
  auStack_140._0_8_ =
       (double)auStack_140._0_8_ * dStack_160 +
       dVar19 + (double)local_158 * dStack_1c0 + (double)auStack_150._0_8_ * dStack_1a0;
  dVar19 = local_1b8 * dStack_130;
  dVar25 = (double)local_128._0_8_ * local_198;
  dVar33 = (double)local_128._0_8_ * dStack_190;
  dVar12 = (double)local_128._8_8_ * local_178;
  dVar21 = (double)local_128._8_8_ * dStack_170;
  dVar29 = (double)local_128._0_8_ * dStack_180;
  local_128._0_8_ =
       (double)local_128._8_8_ * local_168 +
       (double)local_128._0_8_ * local_188 +
       (double)auStack_140._8_8_ * local_1c8 + dStack_130 * local_1a8;
  local_128._8_8_ =
       (double)local_128._8_8_ * dStack_160 +
       dVar29 + (double)auStack_140._8_8_ * dStack_1c0 + dStack_130 * dStack_1a0;
  dVar22 = (double)local_118._0_8_ * dVar11;
  dVar29 = local_108 * local_198;
  dVar34 = local_108 * dStack_190;
  dVar13 = (double)auStack_100._0_8_ * local_178;
  dVar23 = (double)auStack_100._0_8_ * dStack_170;
  dVar35 = local_108 * dStack_180;
  local_108 = (double)auStack_100._0_8_ * local_168 +
              local_108 * local_188 +
              (double)local_118._0_8_ * local_1c8 + (double)local_118._8_8_ * local_1a8;
  auStack_100._0_8_ =
       (double)auStack_100._0_8_ * dStack_160 +
       dVar35 + (double)local_118._0_8_ * dStack_1c0 + (double)local_118._8_8_ * dStack_1a0;
  dVar35 = local_1b8 * (double)auStack_f0._0_8_;
  dVar37 = local_198 * (double)auStack_f0._8_8_;
  dVar36 = dStack_190 * (double)auStack_f0._8_8_;
  dVar14 = local_178 * dStack_e0;
  dVar24 = dStack_170 * dStack_e0;
  dVar42 = dStack_e0 * local_168;
  dStack_e0 = dStack_e0 * dStack_160 +
              (double)auStack_f0._8_8_ * dStack_180 +
              (double)auStack_100._8_8_ * dStack_1c0 + (double)auStack_f0._0_8_ * dStack_1a0;
  auStack_f0._8_8_ =
       dVar42 + (double)auStack_f0._8_8_ * local_188 +
                (double)auStack_100._8_8_ * local_1c8 + (double)auStack_f0._0_8_ * local_1a8;
  auStack_f0._0_8_ =
       dVar24 + dVar36 + dVar11 * (double)auStack_100._8_8_ + dStack_1b0 * (double)auStack_f0._0_8_;
  local_158 = (undefined1  [8])
              (dVar38 + dVar40 + (double)local_158 * dVar10 + (double)auStack_150._0_8_ * local_1b8)
  ;
  dStack_130 = dVar21 + dVar33 + (double)auStack_140._8_8_ * dVar11 + dStack_1b0 * dStack_130;
  auStack_150._0_8_ = dVar20 + dVar41 + dVar7 + (double)auStack_150._0_8_ * dStack_1b0;
  auStack_140._8_8_ = dVar12 + dVar25 + (double)auStack_140._8_8_ * dVar10 + dVar19;
  local_118._0_8_ =
       dVar13 + dVar29 + (double)local_118._0_8_ * dVar10 + local_1b8 * (double)local_118._8_8_;
  local_118._8_8_ = dVar23 + dVar34 + dVar22 + dStack_1b0 * (double)local_118._8_8_;
  auStack_100._8_8_ = dVar14 + dVar37 + dVar10 * (double)auStack_100._8_8_ + dVar35;
  testProcrustesWithMatrix<float>((M44d *)local_158);
  local_158 = (undefined1  [8])((double)local_158 * 1.5);
  auStack_150._0_8_ = (double)auStack_150._0_8_ * 1.5;
  auStack_150._8_8_ = (double)auStack_150._8_8_ * 1.5;
  auStack_140._0_8_ = (double)auStack_140._0_8_ * 1.5;
  auStack_140._8_8_ = (double)auStack_140._8_8_ * 6.400000095367432;
  dStack_130 = dStack_130 * 6.400000095367432;
  local_128._0_8_ = (double)local_128._0_8_ * 6.400000095367432;
  local_128._8_8_ = (double)local_128._8_8_ * 6.400000095367432;
  local_118._0_8_ = (double)local_118._0_8_ + (double)local_118._0_8_;
  local_118._8_8_ = (double)local_118._8_8_ + (double)local_118._8_8_;
  local_108 = local_108 + local_108;
  auStack_100._0_8_ = (double)auStack_100._0_8_ + (double)auStack_100._0_8_;
  testProcrustesWithMatrix<float>((M44d *)local_158);
  Imath_3_2::Euler<double>::toMatrix44((Matrix44<double> *)local_1d8,&local_58);
  local_278 = (double)CONCAT44(local_1d8._4_4_,local_1d8._0_4_);
  dStack_270 = (double)CONCAT44(uStack_1cc,fStack_1d0);
  local_218 = local_1b8;
  dStack_210 = dStack_1b0;
  dVar29 = (double)local_158 * dStack_270;
  dVar11 = (double)auStack_150._8_8_ * dStack_190;
  local_238 = local_198;
  dStack_230 = dStack_190;
  dVar34 = (double)auStack_140._0_8_ * dStack_170;
  local_228 = local_178;
  dStack_220 = dStack_170;
  dVar7 = auStack_f0._0_8_;
  local_248._8_4_ = auStack_f0._0_4_;
  local_248._0_8_ = dVar7;
  local_248._12_4_ = auStack_f0._4_4_;
  dVar37 = (double)auStack_f0._8_8_ * local_198;
  dVar35 = (double)auStack_f0._8_8_ * dStack_190;
  dVar10 = dStack_e0 * local_178;
  dVar19 = dStack_e0 * dStack_170;
  local_268 = local_1a8;
  dStack_260 = dStack_1a0;
  local_1f8 = local_1c8;
  dStack_1f0 = dStack_1c0;
  dVar36 = (double)local_158 * local_1c8;
  dVar38 = (double)local_158 * dStack_1c0;
  local_258 = local_188;
  dStack_250 = dStack_180;
  dVar33 = (double)auStack_140._0_8_ * local_168;
  local_1e8 = local_168;
  dStack_1e0 = dStack_160;
  dVar25 = dStack_e0 * local_168;
  dStack_e0 = dStack_e0 * dStack_160 +
              (double)auStack_f0._8_8_ * dStack_180 +
              (double)auStack_100._8_8_ * dStack_1c0 + (double)local_248._8_8_ * dStack_1a0;
  auStack_f0._8_8_ =
       dVar25 + (double)auStack_f0._8_8_ * local_188 +
                (double)auStack_100._8_8_ * local_1c8 + dVar7 * local_1a8;
  auStack_f0._0_8_ = dVar19 + dVar35 + (double)auStack_100._8_8_ * dStack_270 + dStack_1b0 * dVar7;
  local_158 = (undefined1  [8])
              -((double)auStack_140._0_8_ * local_178 +
               (double)auStack_150._8_8_ * local_198 +
               (double)local_158 * local_278 + (double)auStack_150._0_8_ * local_1b8);
  auStack_140._0_8_ =
       -((double)auStack_140._0_8_ * dStack_160 +
        (double)auStack_150._8_8_ * dStack_180 + dVar38 + (double)auStack_150._0_8_ * dStack_1a0);
  auStack_150._8_8_ =
       -(dVar33 + (double)auStack_150._8_8_ * local_188 +
                  dVar36 + (double)auStack_150._0_8_ * local_1a8);
  auStack_150._0_8_ = -(dVar34 + dVar11 + dVar29 + (double)auStack_150._0_8_ * dStack_1b0);
  dVar11 = local_1b8 * dStack_130;
  dVar19 = (double)local_128._0_8_ * local_198;
  dVar25 = (double)local_128._0_8_ * dStack_190;
  dVar29 = (double)local_128._8_8_ * local_178;
  dVar35 = (double)local_128._8_8_ * dStack_170;
  dVar33 = (double)local_128._0_8_ * dStack_180;
  local_128._0_8_ =
       (double)local_128._8_8_ * local_168 +
       (double)local_128._0_8_ * local_188 +
       (double)auStack_140._8_8_ * local_1c8 + dStack_130 * local_1a8;
  local_128._8_8_ =
       (double)local_128._8_8_ * dStack_160 +
       dVar33 + (double)auStack_140._8_8_ * dStack_1c0 + dStack_130 * dStack_1a0;
  dVar33 = dStack_270 * (double)local_118._0_8_;
  local_198 = local_198 * local_108;
  dStack_190 = dStack_190 * local_108;
  local_178 = local_178 * (double)auStack_100._0_8_;
  dStack_170 = dStack_170 * (double)auStack_100._0_8_;
  dStack_180 = local_108 * dStack_180;
  local_108 = (double)auStack_100._0_8_ * local_168 +
              local_108 * local_188 +
              (double)local_118._0_8_ * local_1c8 + (double)local_118._8_8_ * local_1a8;
  auStack_100._0_8_ =
       (double)auStack_100._0_8_ * dStack_160 +
       dStack_180 + (double)local_118._0_8_ * dStack_1c0 + (double)local_118._8_8_ * dStack_1a0;
  dStack_130 = dVar35 + dVar25 + (double)auStack_140._8_8_ * dStack_270 + dStack_1b0 * dStack_130;
  auStack_140._8_8_ = dVar29 + dVar19 + (double)auStack_140._8_8_ * local_278 + dVar11;
  local_118._0_8_ =
       local_178 +
       local_198 + local_278 * (double)local_118._0_8_ + local_1b8 * (double)local_118._8_8_;
  local_118._8_8_ = dStack_170 + dStack_190 + dVar33 + dStack_1b0 * (double)local_118._8_8_;
  auStack_100._8_8_ = dVar10 + dVar37 + (double)auStack_100._8_8_ * local_278 + local_1b8 * dVar7;
  testProcrustesWithMatrix<float>((M44d *)local_158);
  dStack_130 = dStack_130 * 0.0010000000474974513;
  auStack_140._8_8_ = (double)auStack_140._8_8_ * 0.0010000000474974513;
  local_128._8_8_ = (double)local_128._8_8_ * 0.0010000000474974513;
  local_128._0_8_ = (double)local_128._0_8_ * 0.0010000000474974513;
  testProcrustesWithMatrix<float>((M44d *)local_158);
  local_118._8_8_ = (double)local_118._8_8_ * 0.0;
  local_118._0_8_ = (double)local_118._0_8_ * 0.0;
  local_108 = local_108 * 0.0;
  auStack_100._0_8_ = (double)auStack_100._0_8_ * 0.0;
  testProcrustesWithMatrix<float>((M44d *)local_158);
  if (local_2b8.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.
                    super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.
                          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.
                          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_298.super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.
                    super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_298.
                          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_298.
                          super__Vector_base<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
testProcrustesImp ()
{
    // Test the empty case:
    IMATH_INTERNAL_NAMESPACE::M44d id = procrustesRotationAndTranslation (
        (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
        (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
        (T*) 0,
        0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d ());

    id = procrustesRotationAndTranslation (
        (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
        (IMATH_INTERNAL_NAMESPACE::Vec3<T>*) 0,
        0);
    assert (id == IMATH_INTERNAL_NAMESPACE::M44d ());

    // First we'll test with a bunch of known translation/rotation matrices
    // to make sure we get back exactly the same points:
    IMATH_INTERNAL_NAMESPACE::M44d m;
    m.makeIdentity ();
    testTranslationRotationMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d (3.0, 5.0, -0.2));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (M_PI, 0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (0, M_PI / 4.0, 0));
    testTranslationRotationMatrix<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (0, 0, -3.0 / 4.0 * M_PI));
    testTranslationRotationMatrix<T> (m);

    m.makeIdentity ();
    testWithTranslateRotateAndScale<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::V3d (0.4, 6.0, 10.0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (M_PI, 0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (0, M_PI / 4.0, 0));
    testWithTranslateRotateAndScale<T> (m);

    m.rotate (IMATH_INTERNAL_NAMESPACE::V3d (0, 0, -3.0 / 4.0 * M_PI));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d (2.0, 2.0, 2.0));
    testWithTranslateRotateAndScale<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::V3d (0.01, 0.01, 0.01));
    testWithTranslateRotateAndScale<T> (m);

    // Now we'll test with some random point sets and verify
    // the various Procrustes properties:
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> fromPoints;
    std::vector<IMATH_INTERNAL_NAMESPACE::Vec3<T>> toPoints;
    fromPoints.clear ();
    toPoints.clear ();

    for (size_t i = 0; i < 4; ++i)
    {
        const T theta = T (2 * i) / T (M_PI);
        const T offset = T(M_PI / 3.0);
        fromPoints.push_back (
            IMATH_INTERNAL_NAMESPACE::Vec3<T> (cos (theta), sin (theta), 0));
        toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (
            cos (theta + offset), sin (theta + offset), 0));
    }
    verifyProcrustes (fromPoints, toPoints);

    IMATH_INTERNAL_NAMESPACE::Rand48 random (1209);
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        fromPoints.clear ();
        toPoints.clear ();
        for (size_t i = 0; i < numPoints; ++i)
        {
            fromPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (
                static_cast<T>(random.nextf ()),
                static_cast<T>(random.nextf ()),
                static_cast<T>(random.nextf ())));
            toPoints.push_back (IMATH_INTERNAL_NAMESPACE::Vec3<T> (
                static_cast<T>(random.nextf ()),
                static_cast<T>(random.nextf ()),
                static_cast<T>(random.nextf ())));
        }
    }
    verifyProcrustes (fromPoints, toPoints);

    // Test with some known matrices of varying degrees of quality:
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T> (3, 4, 1));
    testProcrustesWithMatrix<T> (m);

    m.translate (IMATH_INTERNAL_NAMESPACE::Vec3<T> (-10, 2, 1));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot (M_PI / 3.0, 3.0 * M_PI / 4.0, 0);
    m = m * rot.toMatrix44 ();
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T> (T(1.5), T(6.4), T(2.0)));
    testProcrustesWithMatrix<T> (m);

    IMATH_INTERNAL_NAMESPACE::Eulerd rot2 (1.0, M_PI, M_PI / 3.0);
    m = m * rot.toMatrix44 ();

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T> (-1, 1, 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, T(0.001), 1));
    testProcrustesWithMatrix<T> (m);

    m.scale (IMATH_INTERNAL_NAMESPACE::Vec3<T> (1, 1, 0));
    testProcrustesWithMatrix<T> (m);
}